

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_allocator.c
# Opt level: O2

void * metacall_allocator_create(metacall_allocator_id allocator_id,void *ctx)

{
  memory_allocator pmVar1;
  
  if (allocator_id == METACALL_ALLOCATOR_NGINX) {
    pmVar1 = memory_allocator_nginx
                       (*ctx,*(memory_allocator_nginx_impl_palloc *)((long)ctx + 8),
                        *(memory_allocator_nginx_impl_pcopy *)((long)ctx + 0x10),
                        *(memory_allocator_nginx_impl_pfree *)((long)ctx + 0x18));
    return pmVar1;
  }
  if (allocator_id == METACALL_ALLOCATOR_STD) {
    pmVar1 = memory_allocator_std
                       (*ctx,*(memory_allocator_std_impl_realloc *)((long)ctx + 8),
                        *(memory_allocator_std_impl_free *)((long)ctx + 0x10));
    return pmVar1;
  }
  return (void *)0x0;
}

Assistant:

void *metacall_allocator_create(enum metacall_allocator_id allocator_id, void *ctx)
{
	switch (allocator_id)
	{
		case METACALL_ALLOCATOR_STD: {
			metacall_allocator_std std_ctx = (metacall_allocator_std)ctx;

			return memory_allocator_std(std_ctx->malloc, std_ctx->realloc, std_ctx->free);
		}

		case METACALL_ALLOCATOR_NGINX: {
			metacall_allocator_nginx nginx_ctx = (metacall_allocator_nginx)ctx;

			return memory_allocator_nginx((void *)nginx_ctx->pool,
				(memory_allocator_nginx_impl_palloc)nginx_ctx->palloc,
				(memory_allocator_nginx_impl_pcopy)nginx_ctx->pcopy,
				(memory_allocator_nginx_impl_pfree)nginx_ctx->pfree);
		}
	}

	return NULL;
}